

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

bool __thiscall crsGA::Logger::addLogHandler(Logger *this,LogHandlerPtr *logHandler,string *id)

{
  int iVar1;
  mapped_type *pmVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar1 == 0) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<crsGA::LogHandler>_>_>_>
             ::operator[](&this->_logHandlersMap,id);
    (pmVar2->super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (logHandler->super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar2->super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,
               &(logHandler->super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return true;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool Logger::addLogHandler(Logger::LogHandlerPtr logHandler, const std::string &id)
{
    std::lock_guard<std::mutex> lock(_mutex);

    _logHandlersMap[id] = logHandler;
    return true;
}